

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformGradient.cpp
# Opt level: O0

void __thiscall OpenMD::UniformGradient::initialize(UniformGradient *this)

{
  value_type vVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  uint uVar5;
  size_type sVar6;
  reference pvVar7;
  double *pdVar8;
  SnapshotManager *this_00;
  long in_RDI;
  RealType RVar9;
  double dVar10;
  RectMatrix<double,_3U,_3U> *this_01;
  int storageLayout_;
  vector<double,_std::allocator<double>_> d2;
  vector<double,_std::allocator<double>_> d1;
  bool haveG;
  bool haveB;
  bool haveA;
  Globals *in_stack_fffffffffffffe88;
  Vector<double,_3U> *in_stack_fffffffffffffe90;
  Vector<double,_3U> *in_stack_fffffffffffffe98;
  double dVar11;
  Vector<double,_3U> *in_stack_fffffffffffffea0;
  double dVar12;
  vector<double,_std::allocator<double>_> local_50;
  vector<double,_std::allocator<double>_> local_28;
  byte local_b;
  byte local_a;
  byte local_9;
  
  local_9 = 0;
  local_a = 0;
  local_b = 0;
  bVar4 = Globals::haveUniformGradientDirection1((Globals *)0x1ad3b0);
  if (bVar4) {
    Globals::getUniformGradientDirection1(in_stack_fffffffffffffe88);
    sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_28);
    if (sVar6 != 3) {
      sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_28);
      snprintf(painCave.errMsg,2000,
               "uniformGradientDirection1: Incorrect number of parameters\n\tspecified. There should be 3 parameters, but %zu were\n\tspecified.\n"
               ,sVar6);
      painCave.isFatal = 1;
      simError();
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,0);
    vVar1 = *pvVar7;
    pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x68));
    *pdVar8 = vVar1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,1);
    vVar1 = *pvVar7;
    pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x68));
    *pdVar8 = vVar1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_28,2);
    vVar1 = *pvVar7;
    pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x68));
    *pdVar8 = vVar1;
    Vector<double,_3U>::normalize(in_stack_fffffffffffffe90);
    local_9 = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0);
  }
  bVar4 = Globals::haveUniformGradientDirection2((Globals *)0x1ad57d);
  if (bVar4) {
    Globals::getUniformGradientDirection2(in_stack_fffffffffffffe88);
    sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_50);
    if (sVar6 != 3) {
      sVar6 = std::vector<double,_std::allocator<double>_>::size(&local_50);
      snprintf(painCave.errMsg,2000,
               "uniformGradientDirection2: Incorrect number of parameters\n\tspecified. There should be 3 parameters, but %zu were\n\tspecified.\n"
               ,sVar6);
      painCave.isFatal = 1;
      simError();
    }
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,0);
    vVar1 = *pvVar7;
    pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x80));
    *pdVar8 = vVar1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,1);
    vVar1 = *pvVar7;
    pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x80));
    *pdVar8 = vVar1;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](&local_50,2);
    vVar1 = *pvVar7;
    pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x80));
    *pdVar8 = vVar1;
    Vector<double,_3U>::normalize(in_stack_fffffffffffffe90);
    local_a = 1;
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffea0);
  }
  bVar4 = Globals::haveUniformGradientStrength((Globals *)0x1ad74a);
  if (bVar4) {
    RVar9 = Globals::getUniformGradientStrength((Globals *)0x1ad761);
    *(RealType *)(in_RDI + 0x98) = RVar9;
    local_b = 1;
  }
  if ((((local_9 & 1) == 0) || ((local_a & 1) == 0)) || ((local_b & 1) == 0)) {
    if ((local_9 & 1) == 0) {
      snprintf(painCave.errMsg,2000,"UniformGradient: uniformGradientDirection1 not specified.\n");
      painCave.isFatal = 1;
      simError();
    }
    if ((local_a & 1) == 0) {
      snprintf(painCave.errMsg,2000,"UniformGradient: uniformGradientDirection2 not specified.\n");
      painCave.isFatal = 1;
      simError();
    }
    if ((local_b & 1) == 0) {
      snprintf(painCave.errMsg,2000,"UniformGradient: uniformGradientStrength not specified.\n");
      painCave.isFatal = 1;
      simError();
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x11) = 1;
    dVar10 = dot<double,3u>(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    *(double *)(in_RDI + 0xa0) = dVar10;
    pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x68));
    dVar10 = *pdVar8;
    pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x80));
    this_01 = (RectMatrix<double,_3U,_3U> *)
              ((dVar10 * *pdVar8 + -(*(double *)(in_RDI + 0xa0) / 3.0)) * 2.0);
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),0,0);
    *pdVar8 = (double)this_01;
    pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x68));
    dVar12 = *pdVar8;
    pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x80));
    dVar2 = *pdVar8;
    pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x68));
    dVar11 = *pdVar8;
    pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x80));
    dVar3 = *pdVar8;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),0,1);
    *pdVar8 = dVar12 * dVar2 + dVar11 * dVar3;
    pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x68));
    dVar12 = *pdVar8;
    pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x80));
    dVar2 = *pdVar8;
    pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x68));
    dVar11 = *pdVar8;
    pdVar8 = Vector3<double>::x((Vector3<double> *)(in_RDI + 0x80));
    dVar3 = *pdVar8;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),0,2);
    *pdVar8 = dVar12 * dVar2 + dVar11 * dVar3;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),0,1);
    dVar12 = *pdVar8;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),1,0);
    *pdVar8 = dVar12;
    pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x68));
    dVar12 = *pdVar8;
    pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x80));
    dVar2 = *pdVar8;
    dVar11 = *(double *)(in_RDI + 0xa0);
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),1,1);
    *pdVar8 = (dVar12 * dVar2 + -(dVar11 / 3.0)) * 2.0;
    pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x68));
    dVar12 = *pdVar8;
    pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x80));
    dVar2 = *pdVar8;
    pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x68));
    dVar11 = *pdVar8;
    pdVar8 = Vector3<double>::y((Vector3<double> *)(in_RDI + 0x80));
    dVar3 = *pdVar8;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),1,2);
    *pdVar8 = dVar12 * dVar2 + dVar11 * dVar3;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),0,2);
    dVar12 = *pdVar8;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),2,0);
    *pdVar8 = dVar12;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),1,2);
    dVar12 = *pdVar8;
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),2,1);
    *pdVar8 = dVar12;
    pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x68));
    dVar12 = *pdVar8;
    pdVar8 = Vector3<double>::z((Vector3<double> *)(in_RDI + 0x80));
    dVar2 = *pdVar8;
    dVar11 = *(double *)(in_RDI + 0xa0);
    pdVar8 = RectMatrix<double,_3U,_3U>::operator()
                       ((RectMatrix<double,_3U,_3U> *)(in_RDI + 0x20),2,2);
    *pdVar8 = (dVar12 * dVar2 + -(dVar11 / 3.0)) * 2.0;
    RectMatrix<double,_3U,_3U>::operator*=(this_01,dVar10);
  }
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
  uVar5 = SnapshotManager::getAtomStorageLayout(this_00);
  if ((uVar5 & 0x40) != 0) {
    *(undefined1 *)(in_RDI + 0x12) = 1;
  }
  *(undefined1 *)(in_RDI + 0x10) = 1;
  return;
}

Assistant:

void UniformGradient::initialize() {
    bool haveA = false;
    bool haveB = false;
    bool haveG = false;

    if (simParams->haveUniformGradientDirection1()) {
      std::vector<RealType> d1 = simParams->getUniformGradientDirection1();
      if (d1.size() != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "uniformGradientDirection1: Incorrect number of parameters\n"
                 "\tspecified. There should be 3 parameters, but %zu were\n"
                 "\tspecified.\n",
                 d1.size());
        painCave.isFatal = 1;
        simError();
      }
      a_.x() = d1[0];
      a_.y() = d1[1];
      a_.z() = d1[2];

      a_.normalize();
      haveA = true;
    }

    if (simParams->haveUniformGradientDirection2()) {
      std::vector<RealType> d2 = simParams->getUniformGradientDirection2();
      if (d2.size() != 3) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "uniformGradientDirection2: Incorrect number of parameters\n"
                 "\tspecified. There should be 3 parameters, but %zu were\n"
                 "\tspecified.\n",
                 d2.size());
        painCave.isFatal = 1;
        simError();
      }
      b_.x() = d2[0];
      b_.y() = d2[1];
      b_.z() = d2[2];

      b_.normalize();
      haveB = true;
    }

    if (simParams->haveUniformGradientStrength()) {
      g_    = simParams->getUniformGradientStrength();
      haveG = true;
    }

    if (haveA && haveB && haveG) {
      doUniformGradient = true;
      cpsi_             = dot(a_, b_);

      Grad_(0, 0) = 2.0 * (a_.x() * b_.x() - cpsi_ / 3.0);
      Grad_(0, 1) = a_.x() * b_.y() + a_.y() * b_.x();
      Grad_(0, 2) = a_.x() * b_.z() + a_.z() * b_.x();
      Grad_(1, 0) = Grad_(0, 1);
      Grad_(1, 1) = 2.0 * (a_.y() * b_.y() - cpsi_ / 3.0);
      Grad_(1, 2) = a_.y() * b_.z() + a_.z() * b_.y();
      Grad_(2, 0) = Grad_(0, 2);
      Grad_(2, 1) = Grad_(1, 2);
      Grad_(2, 2) = 2.0 * (a_.z() * b_.z() - cpsi_ / 3.0);

      Grad_ *= g_ / 2.0;

    } else {
      if (!haveA) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientDirection1 not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveB) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientDirection2 not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
      if (!haveG) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "UniformGradient: uniformGradientStrength not specified.\n");
        painCave.isFatal = 1;
        simError();
      }
    }

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;
    initialized = true;
  }